

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall cmCTestP4::DescribeParser::DoDiffLine(DescribeParser *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  undefined1 local_b0 [8];
  string action;
  size_t found;
  undefined1 local_58 [8];
  string Path;
  Change change;
  DescribeParser *this_local;
  
  change.Path.field_2._8_8_ = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexDiff,&(this->super_LineParser).Line);
  if (bVar1) {
    cmCTestGlobalVC::Change::Change((Change *)((long)&Path.field_2 + 8),'?');
    cmsys::RegularExpression::match_abi_cxx11_((string *)local_58,&this->RegexDiff,1);
    uVar2 = std::__cxx11::string::length();
    if ((((2 < uVar2) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_58), *pcVar3 == '/')) &&
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_58), *pcVar3 == '/')) &&
       (lVar4 = std::__cxx11::string::find((char)local_58,0x2f), lVar4 != -1)) {
      std::__cxx11::string::substr((ulong)((long)&action.field_2 + 8),(ulong)local_58);
      std::__cxx11::string::operator=
                ((string *)local_58,(string *)(action.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(action.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::operator=((string *)&change,(string *)local_58);
    cmsys::RegularExpression::match_abi_cxx11_((string *)local_b0,&this->RegexDiff,2);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"add");
    if (bVar1) {
      Path.field_2._M_local_buf[8] = 'A';
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,"delete");
      if (bVar1) {
        Path.field_2._M_local_buf[8] = 'D';
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0,"edit");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b0,"integrate"), bVar1)) {
          Path.field_2._M_local_buf[8] = 'M';
        }
      }
    }
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,(value_type *)((long)&Path.field_2 + 8));
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_58);
    cmCTestGlobalVC::Change::~Change((Change *)((long)&Path.field_2 + 8));
  }
  return;
}

Assistant:

void DoDiffLine()
  {
    if (this->RegexDiff.find(this->Line)) {
      Change change;
      std::string Path = this->RegexDiff.match(1);
      if (Path.length() > 2 && Path[0] == '/' && Path[1] == '/') {
        size_t found = Path.find('/', 2);
        if (found != std::string::npos) {
          Path = Path.substr(found + 1);
        }
      }

      change.Path = Path;
      std::string action = this->RegexDiff.match(2);

      if (action == "add") {
        change.Action = 'A';
      } else if (action == "delete") {
        change.Action = 'D';
      } else if (action == "edit" || action == "integrate") {
        change.Action = 'M';
      }

      Changes.push_back(change);
    }
  }